

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O0

void Test_Demangle_CornerCases::RunTest(void)

{
  bool bVar1;
  int iVar2;
  char *mangled;
  char *demangled;
  char tmp [10];
  size_t size;
  
  tmp[2] = '\n';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  memset((void *)((long)&demangled + 6),0,10);
  bVar1 = google::Demangle("_Z6foobarv",(char *)((long)&demangled + 6),10);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(mangled, tmp, sizeof(tmp))");
    exit(1);
  }
  iVar2 = strcmp("foobar()",(char *)((long)&demangled + 6));
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","demangled","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_Z6foobarv",(char *)((long)&demangled + 6),9);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","Demangle(mangled, tmp, size - 1)");
    exit(1);
  }
  iVar2 = strcmp("foobar()",(char *)((long)&demangled + 6));
  if (iVar2 != 0) {
    fprintf(_stderr,"Check failed: streq(%s, %s)\n","demangled","tmp");
    exit(1);
  }
  bVar1 = google::Demangle("_Z6foobarv",(char *)((long)&demangled + 6),8);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(Demangle(mangled, tmp, size - 2))");
    exit(1);
  }
  bVar1 = google::Demangle("_Z6foobarv",(char *)((long)&demangled + 6),1);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(Demangle(mangled, tmp, 1))");
    exit(1);
  }
  bVar1 = google::Demangle("_Z6foobarv",(char *)((long)&demangled + 6),0);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(Demangle(mangled, tmp, 0))");
    exit(1);
  }
  bVar1 = google::Demangle("_Z6foobarv",(char *)0x0,0);
  if (!bVar1) {
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","!(Demangle(mangled, nullptr, 0))");
  exit(1);
}

Assistant:

TEST(Demangle, CornerCases) {
  const size_t size = 10;
  char tmp[size] = {0};
  const char* demangled = "foobar()";
  const char* mangled = "_Z6foobarv";
  EXPECT_TRUE(Demangle(mangled, tmp, sizeof(tmp)));
  // sizeof("foobar()") == size - 1
  EXPECT_STREQ(demangled, tmp);
  EXPECT_TRUE(Demangle(mangled, tmp, size - 1));
  EXPECT_STREQ(demangled, tmp);
  EXPECT_FALSE(Demangle(mangled, tmp, size - 2));  // Not enough.
  EXPECT_FALSE(Demangle(mangled, tmp, 1));
  EXPECT_FALSE(Demangle(mangled, tmp, 0));
  EXPECT_FALSE(Demangle(mangled, nullptr, 0));  // Should not cause SEGV.
}